

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::SerialArena::CleanupList(SerialArena *this)

{
  char *pcVar1;
  long num;
  CleanupNode *it;
  CleanupNode *limit;
  Block *b;
  SerialArena *this_local;
  
  limit = (CleanupNode *)this->head_;
  ((Block *)limit)->start = (CleanupNode *)this->limit_;
  do {
    pcVar1 = Block::Pointer((Block *)limit,(ulong)limit->cleanup & 0xfffffffffffffff8);
    num = (long)limit[1].elem;
    if (0 < (long)pcVar1 - num >> 4) {
      for (; (ulong)num < pcVar1; num = num + 0x10) {
        (**(code **)(num + 8))(*(undefined8 *)num);
      }
    }
    limit = (CleanupNode *)limit->elem;
  } while (limit != (CleanupNode *)0x0);
  return;
}

Assistant:

void SerialArena::CleanupList() {
  Block* b = head_;
  b->start = reinterpret_cast<CleanupNode*>(limit_);
  do {
    auto* limit = reinterpret_cast<CleanupNode*>(
        b->Pointer(b->size & static_cast<size_t>(-8)));
    auto it = b->start;
    auto num = limit - it;
    if (num > 0) {
      for (; it < limit; it++) {
        it->cleanup(it->elem);
      }
    }
    b = b->next;
  } while (b);
}